

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O3

string * getAttribute(string *__return_storage_ptr__,string *source,string *attrName)

{
  long lVar1;
  string *psVar2;
  string *extraout_RAX;
  long in_RCX;
  string attr_namefull;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,attrName,(long)&(attrName->_M_dataplus)._M_p + in_RCX);
  std::__cxx11::string::append((char *)&local_40);
  lVar1 = std::__cxx11::string::find((char *)source,(ulong)local_40,0);
  std::__cxx11::string::find((char *)source,0x445fb9,lVar1 + local_38);
  psVar2 = (string *)std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)source);
  if (local_40 != local_30) {
    operator_delete(local_40);
    psVar2 = extraout_RAX;
  }
  return psVar2;
}

Assistant:

static std::string getAttribute(const std::string &source, const std::string &attrName) {
	std::string attr_namefull = attrName + "=\"";
	std::size_t startpos = source.find(attr_namefull) + attr_namefull.size();
	std::size_t endpos = source.find("\"", startpos);
	return source.substr(startpos, endpos - startpos);
}